

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void __thiscall bpwriter::format_with_padding(bpwriter *this,char *str,fmtopts *opts)

{
  wchar_t wVar1;
  char *pcVar2;
  size_t chars;
  ulong bytes;
  int iVar3;
  byte *addstr;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  
  bytes = (ulong)*(ushort *)str;
  addstr = (byte *)(str + 2);
  chars = 0;
  if (bytes != 0) {
    pbVar4 = addstr;
    do {
      pbVar4 = pbVar4 + (ulong)(((*pbVar4 >> 5 & 1) != 0) + 1 & (uint)(*pbVar4 >> 7) * 3) + 1;
      chars = chars + 1;
    } while (pbVar4 < str + bytes + 2);
    format_with_padding(this,(char *)addstr,bytes,chars,opts);
    return;
  }
  iVar3 = opts->width;
  iVar5 = iVar3;
  if (iVar3 < 1) {
    iVar5 = 0;
  }
  if ((opts->left_align == 0) && (iVar5 != 0)) {
    wVar1 = opts->pad;
    iVar6 = 0;
    if (0 < iVar3) {
      iVar6 = iVar3;
    }
    iVar6 = -iVar6;
    do {
      pcVar2 = CVmObjString::cons_append(this->str,this->dst,wVar1,0x40);
      this->dst = pcVar2;
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0);
  }
  pcVar2 = CVmObjString::cons_append(this->str,this->dst,(char *)addstr,0,0x40);
  this->dst = pcVar2;
  if ((opts->left_align != 0) && (iVar5 != 0)) {
    wVar1 = opts->pad;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    iVar3 = -iVar3;
    do {
      pcVar2 = CVmObjString::cons_append(this->str,this->dst,wVar1,0x40);
      this->dst = pcVar2;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void format_with_padding(VMG_ const char *str, const fmtopts &opts)
    {
        /* figure the byte length and get the buffer */
        size_t bytes = vmb_get_len(str);
        str += VMB_LEN;

        /* figure the character length */
        utf8_ptr p((char *)str);
        size_t chars = p.len(bytes);

        /* write it out */
        format_with_padding(vmg_ str, bytes, chars, opts);
    }